

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxvfmt.cpp
# Opt level: O2

uint32 rw::xbox::getVertexFmtStride(uint32 fmt)

{
  uint32 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  int iVar6;
  
  uVar4 = fmt >> 4 & 0xf;
  iVar2 = 4;
  iVar3 = iVar2;
  if ((fmt & 0xf) != 4) {
    iVar3 = *(int *)(vertexFormatSizes + (ulong)(fmt & 0xf) * 4) * 3;
  }
  iVar6 = iVar2;
  if (uVar4 != 4) {
    iVar6 = *(int *)(vertexFormatSizes + (ulong)uVar4 * 4) * 3;
  }
  uVar5 = (fmt >> 0x16 & 4) + iVar3 + iVar6;
  for (iVar3 = 8; iVar3 != 0x18; iVar3 = iVar3 + 4) {
    uVar4 = fmt >> ((byte)iVar3 & 0x1f) & 0xf;
    iVar6 = iVar2;
    if (uVar4 != 4) {
      iVar6 = *(int *)(vertexFormatSizes + (ulong)uVar4 * 4) * 2;
    }
    uVar5 = uVar5 + iVar6;
  }
  uVar1 = uVar5 + 8;
  if ((fmt & 0xe000000) == 0) {
    uVar1 = uVar5;
  }
  return uVar1;
}

Assistant:

uint32
getVertexFmtStride(uint32 fmt)
{
	uint32 stride = 0;
	uint32 v = fmt & 0xF;
	uint32 n = (fmt >> 4) & 0xF;
	stride += v == 4 ? 4 : 3*vertexFormatSizes[v];
	stride += n == 4 ? 4 : 3*vertexFormatSizes[n];
	if(fmt & 0x1000000)
		stride += 4;
	for(int i = 0; i < 4; i++){
		uint32 t = (fmt >> (i*4 + 8)) & 0xF;
		stride += t == 4 ? 4 : 2*vertexFormatSizes[t];
	}
	if(fmt & 0xE000000)
		stride += 8;
	return stride;
}